

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicBinding::CheckIndexed
          (BasicBinding *this,GLenum e,GLuint index,GLuint expected)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  GLboolean local_39;
  bool status;
  double dStack_38;
  GLboolean b;
  GLdouble d;
  GLuint GStack_28;
  GLfloat f;
  GLint64 i64;
  GLint i;
  GLuint expected_local;
  GLuint index_local;
  GLenum e_local;
  BasicBinding *this_local;
  
  i64._4_4_ = expected;
  i = index;
  expected_local = e;
  _index_local = this;
  glu::CallLogWrapper::glGetIntegeri_v
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,e,index,(GLint *)&i64);
  glu::CallLogWrapper::glGetInteger64i_v
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,expected_local,i,(GLint64 *)&GStack_28);
  glu::CallLogWrapper::glGetFloati_v
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,expected_local,i,(GLfloat *)((long)&d + 4));
  glu::CallLogWrapper::glGetDoublei_v
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,expected_local,i,&stack0xffffffffffffffc8);
  glu::CallLogWrapper::glGetBooleani_v
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,expected_local,i,&local_39);
  bVar2 = (GLuint)i64 == i64._4_4_;
  bVar3 = GStack_28 == i64._4_4_;
  bVar4 = (GLuint)(long)d._4_4_ == i64._4_4_;
  bVar5 = (GLuint)(long)dStack_38 == i64._4_4_;
  bVar6 = (bool)local_39 == (i64._4_4_ != 0);
  if (!bVar6 || (!bVar5 || (!bVar4 || (!bVar3 || !bVar2)))) {
    pcVar1 = ShaderStorageBufferObjectBase::GLenumToString
                       (&this->super_ShaderStorageBufferObjectBase,expected_local);
    anon_unknown_0::Output
              ("%s at index %d is %d should be %d.\n",pcVar1,(ulong)(uint)i,(ulong)(GLuint)i64,
               (ulong)i64._4_4_);
  }
  return bVar6 && (bVar5 && (bVar4 && (bVar3 && bVar2)));
}

Assistant:

bool CheckIndexed(GLenum e, GLuint index, GLuint expected)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLdouble  d;
		GLboolean b;

		glGetIntegeri_v(e, index, &i);
		glGetInteger64i_v(e, index, &i64);
		glGetFloati_v(e, index, &f);
		glGetDoublei_v(e, index, &d);
		glGetBooleani_v(e, index, &b);

		bool status = true;
		if (static_cast<GLuint>(i) != expected)
			status = false;
		if (static_cast<GLuint>(i64) != expected)
			status = false;
		if (static_cast<GLuint>(f) != expected)
			status = false;
		if (static_cast<GLuint>(d) != expected)
			status = false;
		if (b != (expected != 0 ? GL_TRUE : GL_FALSE))
			status = false;

		if (!status)
		{
			Output("%s at index %d is %d should be %d.\n", GLenumToString(e), index, i, expected);
		}
		return status;
	}